

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

EVP_HPKE_AEAD * bssl::get_ech_aead(uint16_t aead_id)

{
  uint16_t uVar1;
  EVP_HPKE_AEAD *aead_00;
  EVP_HPKE_AEAD *aead;
  _func_EVP_HPKE_AEAD_ptr *aead_func;
  _func_EVP_HPKE_AEAD_ptr **__end1;
  _func_EVP_HPKE_AEAD_ptr **__begin1;
  _func_EVP_HPKE_AEAD_ptr *(*__range1) [3];
  uint16_t aead_id_local;
  
  __end1 = (_func_EVP_HPKE_AEAD_ptr **)&kSupportedAEADs;
  while( true ) {
    if (__end1 == (_func_EVP_HPKE_AEAD_ptr **)&DAT_0064c2e8) {
      return (EVP_HPKE_AEAD *)0x0;
    }
    aead_00 = (**__end1)();
    uVar1 = EVP_HPKE_AEAD_id(aead_00);
    if (aead_id == uVar1) break;
    __end1 = __end1 + 1;
  }
  return aead_00;
}

Assistant:

static const EVP_HPKE_AEAD *get_ech_aead(uint16_t aead_id) {
  for (const auto aead_func : kSupportedAEADs) {
    const EVP_HPKE_AEAD *aead = aead_func();
    if (aead_id == EVP_HPKE_AEAD_id(aead)) {
      return aead;
    }
  }
  return nullptr;
}